

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcOdc.c
# Opt level: O2

int Abc_NtkDontCareSimulate(Odc_Man_t *p,uint *puTruth)

{
  int iVar1;
  uint *q;
  ulong uVar2;
  uint uVar3;
  
  p->nTravIds = p->nTravIds + 1;
  Abc_NtkDontCareSimulate_rec(p,p->iRoot & 0xfffe);
  q = Odc_ObjTruth(p,p->iRoot & 0xfffe);
  Abc_InfoCopy(puTruth,q,p->nWords);
  if ((p->iRoot & 1) != 0) {
    for (uVar2 = (ulong)(uint)p->nWords; 0 < (int)uVar2; uVar2 = uVar2 - 1) {
      puTruth[uVar2 - 1] = ~puTruth[uVar2 - 1];
    }
  }
  uVar2 = (ulong)(uint)(1 << ((char)p->nVarsMax - 5U & 0x1f));
  if (p->nVarsMax < 6) {
    uVar2 = 1;
  }
  iVar1 = 0;
  for (; 0 < (int)uVar2; uVar2 = uVar2 - 1) {
    uVar3 = (puTruth[uVar2 - 1] >> 1 & 0x55555555) + (puTruth[uVar2 - 1] & 0x55555555);
    uVar3 = (uVar3 >> 2 & 0x33333333) + (uVar3 & 0x33333333);
    uVar3 = (uVar3 >> 4 & 0x7070707) + (uVar3 & 0x7070707);
    uVar3 = (uVar3 >> 8 & 0xf000f) + (uVar3 & 0xf000f);
    iVar1 = (uVar3 >> 0x10) + iVar1 + (uVar3 & 0xffff);
  }
  return iVar1;
}

Assistant:

int Abc_NtkDontCareSimulate( Odc_Man_t * p, unsigned * puTruth )
{
    Odc_ManIncrementTravId( p );
    Abc_NtkDontCareSimulate_rec( p, Odc_Regular(p->iRoot) );
    Abc_InfoCopy( puTruth, Odc_ObjTruth(p, Odc_Regular(p->iRoot)), p->nWords );
    if ( Odc_IsComplement(p->iRoot) )
        Abc_InfoNot( puTruth, p->nWords );
    return Extra_TruthCountOnes( puTruth, p->nVarsMax );
}